

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitStringSliceWTF
          (PrintExpressionContents *this,StringSliceWTF *curr)

{
  char *str;
  
  if (curr->op == StringSliceWTF8) {
    str = "stringview_wtf8.slice";
  }
  else {
    if (curr->op != StringSliceWTF16) {
      handle_unreachable("invalid string.slice*",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                         ,0x9d9);
    }
    str = "stringview_wtf16.slice";
  }
  printMedium(this->o,str);
  return;
}

Assistant:

void visitStringSliceWTF(StringSliceWTF* curr) {
    switch (curr->op) {
      case StringSliceWTF8:
        printMedium(o, "stringview_wtf8.slice");
        break;
      case StringSliceWTF16:
        printMedium(o, "stringview_wtf16.slice");
        break;
      default:
        WASM_UNREACHABLE("invalid string.slice*");
    }
  }